

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindowSettings * ImGui::FindOrCreateWindowSettings(char *name)

{
  ImGuiWindowSettings *pIVar1;
  char *in_RDI;
  ImGuiWindowSettings *settings;
  char *in_stack_00000030;
  undefined8 in_stack_fffffffffffffff8;
  ImGuiID id;
  
  id = (ImGuiID)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  ImHashStr(in_RDI,0,0);
  pIVar1 = FindWindowSettings(id);
  if (pIVar1 == (ImGuiWindowSettings *)0x0) {
    pIVar1 = CreateNewWindowSettings(in_stack_00000030);
  }
  return pIVar1;
}

Assistant:

ImGuiWindowSettings* ImGui::FindOrCreateWindowSettings(const char* name)
{
    if (ImGuiWindowSettings* settings = FindWindowSettings(ImHashStr(name)))
        return settings;
    return CreateNewWindowSettings(name);
}